

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

void Curl_llist_move(curl_llist *list,curl_llist_element *e,curl_llist *to_list,
                    curl_llist_element *to_e)

{
  size_t sVar1;
  curl_llist *pcVar2;
  curl_llist_element **ppcVar3;
  curl_llist_element *pcVar4;
  
  if ((e != (curl_llist_element *)0x0) && (sVar1 = list->size, sVar1 != 0)) {
    pcVar2 = (curl_llist *)e->next;
    if (list->head == e) {
      list->head = (curl_llist_element *)pcVar2;
      pcVar4 = (curl_llist_element *)0x0;
    }
    else {
      pcVar4 = e->prev;
      pcVar4->next = (curl_llist_element *)pcVar2;
      pcVar2 = (curl_llist *)e->next;
    }
    if (pcVar2 == (curl_llist *)0x0) {
      pcVar2 = list;
    }
    pcVar2->tail = pcVar4;
    list->size = sVar1 - 1;
    sVar1 = to_list->size;
    if (sVar1 == 0) {
      to_list->head = e;
      ppcVar3 = &to_list->tail;
      e->prev = (curl_llist_element *)0x0;
      e->next = (curl_llist_element *)0x0;
    }
    else {
      ppcVar3 = &to_e->next;
      e->next = to_e->next;
      e->prev = to_e;
      pcVar2 = (curl_llist *)to_e->next;
      if ((curl_llist *)to_e->next == (curl_llist *)0x0) {
        pcVar2 = to_list;
      }
      pcVar2->tail = e;
    }
    *ppcVar3 = e;
    to_list->size = sVar1 + 1;
  }
  return;
}

Assistant:

void Curl_llist_move(struct curl_llist *list, struct curl_llist_element *e,
                     struct curl_llist *to_list,
                     struct curl_llist_element *to_e)
{
  /* Remove element from list */
  if(e == NULL || list->size == 0)
    return;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    e->prev->next = e->next;
    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  --list->size;

  /* Add element to to_list after to_e */
  if(to_list->size == 0) {
    to_list->head = e;
    to_list->head->prev = NULL;
    to_list->head->next = NULL;
    to_list->tail = e;
  }
  else {
    e->next = to_e->next;
    e->prev = to_e;
    if(to_e->next) {
      to_e->next->prev = e;
    }
    else {
      to_list->tail = e;
    }
    to_e->next = e;
  }

  ++to_list->size;
}